

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O0

int beagleSetRootPrePartials(int instance,int *bufferIndices,int *stateFrequenciesIndices,int count)

{
  BeagleImpl *pBVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  bad_alloc *anon_var_0;
  out_of_range *anon_var_0_1;
  int returnValue;
  BeagleImpl *beagleInstance;
  int in_stack_ffffffffffffffac;
  undefined4 local_4;
  
  pBVar1 = beagle::getBeagleInstance(in_stack_ffffffffffffffac);
  if (pBVar1 == (BeagleImpl *)0x0) {
    local_4 = -4;
  }
  else {
    local_4 = (**(code **)(*(long *)pBVar1 + 0x40))(pBVar1,in_RSI,in_RDX,in_ECX);
  }
  return local_4;
}

Assistant:

int beagleSetRootPrePartials(const int instance,
                             const int *bufferIndices,
                             const int *stateFrequenciesIndices,
                             int count){
    DEBUG_START_TIME();
    try {
        beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
        if (beagleInstance == NULL)
            return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
        int returnValue = beagleInstance->setRootPrePartials(bufferIndices,
                                                             stateFrequenciesIndices,
                                                             count);
        DEBUG_END_TIME();
        return returnValue;
    }
    catch (std::bad_alloc &) {
        return BEAGLE_ERROR_OUT_OF_MEMORY;
    }
    catch (std::out_of_range &) {
        return BEAGLE_ERROR_OUT_OF_RANGE;
    }
    catch (...) {
        return BEAGLE_ERROR_UNIDENTIFIED_EXCEPTION;
    }
}